

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_aerial_transferrence(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined2 uVar1;
  CHAR_DATA *pCVar2;
  bool bVar3;
  int idam;
  ROOM_INDEX_DATA *room;
  char *txt;
  CHAR_DATA *ch_00;
  
  if (((ch->in_room->room_flags[0] & 0x2000) == 0) &&
     (uVar1 = ch->in_room->sector_type, 1 < (ushort)(uVar1 - 7))) {
    bVar3 = is_affected(ch,(int)gsn_bind_feet);
    pCVar2 = char_list;
    if (!bVar3) {
      do {
        ch_00 = pCVar2;
        if (ch_00 == (CHAR_DATA *)0x0) {
          ch_00 = (CHAR_DATA *)0x0;
          break;
        }
        pCVar2 = ch_00->next;
        bVar3 = is_npc(ch_00);
      } while (((!bVar3) || (ch_00->pIndexData->vnum != 0xb8e)) || (ch_00->hunting != ch));
      if (ch_00 == (CHAR_DATA *)0x0) {
LAB_0031314a:
        do {
          room = get_random_room(ch);
          if ((ushort)room->sector_type < 9) {
            if ((0x1c2U >> ((ushort)room->sector_type & 0x1f) & 1) != 0) goto LAB_0031314a;
          }
        } while ((((room->room_flags[0] & 0x2000) != 0) || (bVar3 = is_explore(room), bVar3)) ||
                (room->cabal != 0));
        act("As you call upon the power of the winds, a large funnel cloud materializes to carry you off into the air!"
            ,ch,(void *)0x0,(void *)0x0,3);
        act("A large funnel cloud materializes out of nowhere and carries $n soaring into the sky!",
            ch,(void *)0x0,(void *)0x0,0);
        char_from_room(ch);
        char_to_room(ch,room);
        act("Without an anchor to secure you, the winds fling you haphazardly through the sky! ",ch,
            (void *)0x0,(void *)0x0,3);
        act("$n plummets suddenly from the sky, hitting the ground hard!",ch,(void *)0x0,(void *)0x0
            ,0);
        do_look(ch,"auto");
        idam = dice(10,10);
        damage_new(ch,ch,idam,sn,1,true,false,0,1,(char *)0x0);
      }
      else {
        act("As you call upon the power of the winds, a large funnel cloud materializes to carry you off into the air!"
            ,ch,(void *)0x0,(void *)0x0,3);
        act("A large funnel cloud materializes out of nowhere and carries $n soaring into the sky!",
            ch,(void *)0x0,(void *)0x0,0);
        char_from_room(ch);
        char_to_room(ch,ch_00->in_room);
        act("You soar through the air and are soon set down beside your anchor.",ch,(void *)0x0,
            (void *)0x0,3);
        act("$n suddenly drops gently to the ground, beside the small funnel cloud.",ch,(void *)0x0,
            (void *)0x0,0);
        do_look(ch,"auto");
      }
      check_plasma_thread(ch,-1);
      return;
    }
    txt = "Your feet are rooted to the ground!\n\r";
  }
  else {
    txt = "You cannot cast that here.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_aerial_transferrence(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *anchor = nullptr, *wch, *wch_next;
	ROOM_INDEX_DATA *pRoomIndex;

	if (IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL)
		|| ch->in_room->sector_type == SECT_INSIDE
		|| ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast that here.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", ch);
		return;
	}

	for (wch = char_list; wch != nullptr; wch = wch_next)
	{
		wch_next = wch->next;

		if (is_npc(wch) && wch->pIndexData->vnum == MOB_VNUM_ANCHOR && wch->hunting == ch)
		{
			anchor = wch;
			break;
		}
	}

	if (anchor)
	{
		act("As you call upon the power of the winds, a large funnel cloud materializes to carry you off into the air!", ch, 0, 0, TO_CHAR);
		act("A large funnel cloud materializes out of nowhere and carries $n soaring into the sky!", ch, 0, 0, TO_ROOM);

		char_from_room(ch);
		char_to_room(ch, anchor->in_room);

		act("You soar through the air and are soon set down beside your anchor.", ch, 0, 0, TO_CHAR);
		act("$n suddenly drops gently to the ground, beside the small funnel cloud.", ch, 0, 0, TO_ROOM);

		do_look(ch, "auto");
		check_plasma_thread(ch, -1);
	}
	else
	{
		for (;;)
		{
			pRoomIndex = get_random_room(ch);

			if (pRoomIndex->sector_type == SECT_CITY
				|| pRoomIndex->sector_type == SECT_INSIDE
				|| pRoomIndex->sector_type == SECT_WATER
				|| pRoomIndex->sector_type == SECT_UNDERWATER)
			{
				continue;
			}

			if (!IS_SET(pRoomIndex->room_flags, ROOM_NO_RECALL) && !is_explore(pRoomIndex) && !pRoomIndex->cabal)
				break;
		}

		act("As you call upon the power of the winds, a large funnel cloud materializes to carry you off into the air!", ch, 0, 0, TO_CHAR);
		act("A large funnel cloud materializes out of nowhere and carries $n soaring into the sky!", ch, 0, 0, TO_ROOM);

		char_from_room(ch);
		char_to_room(ch, pRoomIndex);

		act("Without an anchor to secure you, the winds fling you haphazardly through the sky! ", ch, 0, 0, TO_CHAR);
		act("$n plummets suddenly from the sky, hitting the ground hard!", ch, 0, 0, TO_ROOM);

		do_look(ch, "auto");
		damage_new(ch, ch, dice(10, 10), sn, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
		check_plasma_thread(ch, -1);
	}
}